

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData160 * cfd::core::HashUtil::Ripemd160(ByteData160 *__return_storage_ptr__,Script *script)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  Script::GetData((ByteData *)&local_28,script);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
                     (ByteData *)&local_28);
  Ripemd160(__return_storage_ptr__,
            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

ByteData160 HashUtil::Ripemd160(const Script &script) {
  return Ripemd160(script.GetData().GetBytes());
}